

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O3

char * Scl_LibertyReadString(Scl_Tree_t *p,Scl_Pair_t Pair)

{
  int iVar1;
  Vec_Str_t *pVVar2;
  char *pcVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  size_t __n;
  
  iVar5 = Pair.Beg;
  iVar6 = Pair.End - iVar5;
  pVVar2 = p->vBuffer;
  if (pVVar2->nSize < iVar6 + 2) {
    iVar1 = iVar6 + 100;
    if (pVVar2->nCap < iVar1) {
      if (pVVar2->pArray == (char *)0x0) {
        pcVar3 = (char *)malloc((long)iVar1);
      }
      else {
        pcVar3 = (char *)realloc(pVVar2->pArray,(long)iVar1);
      }
      pVVar2->pArray = pcVar3;
      pVVar2->nCap = iVar1;
    }
    pVVar2->nSize = iVar1;
    if (-100 < iVar6) {
      lVar4 = 0;
      do {
        pVVar2->pArray[lVar4] = '\0';
        lVar4 = lVar4 + 1;
      } while (lVar4 < pVVar2->nSize);
    }
  }
  pcVar3 = p->vBuffer->pArray;
  __n = (size_t)iVar6;
  strncpy(pcVar3,p->pContents + iVar5,__n);
  if ((iVar5 < Pair.End) && (*pcVar3 == '\"')) {
    if (pcVar3[__n - 1] != '\"') {
      __assert_fail("Buffer[Pair.End-Pair.Beg-1] == \'\\\"\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclLiberty.c"
                    ,0x160,"char *Scl_LibertyReadString(Scl_Tree_t *, Scl_Pair_t)");
    }
    pcVar3[__n - 1] = '\0';
    pcVar3 = pcVar3 + 1;
  }
  else {
    pcVar3[__n] = '\0';
  }
  return pcVar3;
}

Assistant:

char * Scl_LibertyReadString( Scl_Tree_t * p, Scl_Pair_t Pair )   
{ 
    // static char Buffer[ABC_MAX_LIB_STR_LEN]; 
    char * Buffer;
    if ( Pair.End - Pair.Beg + 2 > Vec_StrSize(p->vBuffer) )
        Vec_StrFill( p->vBuffer, Pair.End - Pair.Beg + 100, '\0' );
    Buffer = Vec_StrArray( p->vBuffer );
    strncpy( Buffer, p->pContents+Pair.Beg, Pair.End-Pair.Beg ); 
    if ( Pair.Beg < Pair.End && Buffer[0] == '\"' )
    {
        assert( Buffer[Pair.End-Pair.Beg-1] == '\"' );
        Buffer[Pair.End-Pair.Beg-1] = 0;
        return Buffer + 1;
    }
    Buffer[Pair.End-Pair.Beg] = 0;
    return Buffer;
}